

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

int stbir_set_pixel_subrect(STBIR_RESIZE *resize,int subx,int suby,int subw,int subh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4._0_8_ = (double)subx;
  auVar4._8_8_ = (double)suby;
  uVar1 = resize->output_w;
  uVar2 = resize->output_h;
  auVar6._0_8_ = (double)(int)uVar1;
  auVar6._8_8_ = (double)(int)uVar2;
  auVar4 = divpd(auVar4,auVar6);
  resize->input_s0 = (double)auVar4._0_8_;
  resize->input_t0 = (double)auVar4._8_8_;
  auVar5._0_8_ = (double)(subw + subx);
  auVar5._8_8_ = (double)(subh + suby);
  auVar4 = divpd(auVar5,auVar6);
  resize->input_s1 = (double)auVar4._0_8_;
  resize->input_t1 = (double)auVar4._8_8_;
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;
  uVar3 = 0;
  if (((subx < (int)uVar1) && (0 < subw + subx)) && (suby < (int)uVar2)) {
    uVar3 = (uint)((subh != 0 && subw != 0) && 0 < subh + suby);
  }
  return uVar3;
}

Assistant:

STBIRDEF int stbir_set_pixel_subrect( STBIR_RESIZE * resize, int subx, int suby, int subw, int subh )                 // sets both regions (full regions by default)
{
  double s0, t0, s1, t1;

  s0 = ( (double)subx ) / ( (double)resize->output_w );
  t0 = ( (double)suby ) / ( (double)resize->output_h );
  s1 = ( (double)(subx+subw) ) / ( (double)resize->output_w );
  t1 = ( (double)(suby+subh) ) / ( (double)resize->output_h );

  resize->input_s0 = s0;
  resize->input_t0 = t0;
  resize->input_s1 = s1;
  resize->input_t1 = t1;
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;

  // are we inbounds?
  if ( ( subx >= resize->output_w ) || ( ( subx + subw ) <= 0 ) || ( suby >= resize->output_h ) || ( ( suby + subh ) <= 0 ) || ( subw == 0 ) || ( subh == 0 ) )
    return 0;

  return 1;
}